

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> __thiscall
SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
          (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          unsigned_short rhs)

{
  unsigned_short in_SI;
  char *in_RDI;
  char local_13 [18];
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1;
  
  local_13[0] = BinaryAndHelper<signed_char,_unsigned_short,_0>::And(*in_RDI,in_SI);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_1,local_13);
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_1.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator &( U rhs ) const SAFEINT_NOTHROW
    {
        // we want to avoid setting bits by surprise
        // consider the case of lhs = int, value = 0xffffffff
        //                      rhs = char, value = 0xff
        //
        // programmer intent is to get only the lower 8 bits
        // normal behavior is to upcast both sides to an int
        // which then sign extends rhs, setting all the bits

        // If you land in the assert, this is because the bitwise operator
        // was causing unexpected behavior. Fix is to properly cast your inputs
        // so that it works like you meant, not unexpectedly

        return SafeInt< T, E >( BinaryAndHelper< T, U, BinaryMethod< T, U >::method >::And( m_int, rhs ) );
    }